

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall diligent_spirv_cross::Compiler::block_is_pure(Compiler *this,SPIRBlock *block)

{
  ushort uVar1;
  bool bVar2;
  uint32_t *puVar3;
  SPIRType *pSVar4;
  SPIRFunction *func;
  SPIRExtension *pSVar5;
  uint32_t id;
  long lVar6;
  Instruction *i;
  Instruction *instr;
  bool bVar7;
  
  if (*(int *)&(block->super_IVariant).field_0xc - 6U < 4) {
    bVar7 = false;
  }
  else {
    instr = (block->ops).super_VectorView<diligent_spirv_cross::Instruction>.ptr;
    for (lVar6 = (block->ops).super_VectorView<diligent_spirv_cross::Instruction>.buffer_size * 0xc;
        bVar7 = lVar6 == 0, !bVar7; lVar6 = lVar6 + -0xc) {
      puVar3 = stream(this,instr);
      uVar1 = instr->op;
      if (uVar1 - 0x3e < 2) {
        id = *puVar3;
LAB_0068a3c1:
        pSVar4 = expression_type(this,id);
        if (pSVar4->storage != Function) {
          return bVar7;
        }
      }
      else if (uVar1 == 0xc) {
        pSVar5 = get<diligent_spirv_cross::SPIRExtension>(this,puVar3[2]);
        if ((*(int *)&(pSVar5->super_IVariant).field_0xc == 1) && ((puVar3[3] | 0x10) == 0x33)) {
          id = puVar3[5];
          goto LAB_0068a3c1;
        }
      }
      else if (uVar1 == 0x39) {
        func = get<diligent_spirv_cross::SPIRFunction>(this,puVar3[2]);
        bVar2 = function_is_pure(this,func);
        if (!bVar2) {
          return bVar7;
        }
      }
      else {
        if ((uVar1 - 0xda < 0x19) && ((0x1fffecfU >> (uVar1 - 0xda & 0x1f) & 1) != 0)) {
          return bVar7;
        }
        if ((uVar1 - 0x115d < 0x21) && ((0x1f0000003U >> ((ulong)(uVar1 - 0x115d) & 0x3f) & 1) != 0)
           ) {
          return bVar7;
        }
        if ((uVar1 - 0x14d6 < 0x2f) &&
           ((0x40000000040fU >> ((ulong)(uVar1 - 0x14d6) & 0x3f) & 1) != 0)) {
          return bVar7;
        }
        if (uVar1 == 99) {
          return bVar7;
        }
        if (uVar1 == 0x14af) {
          return bVar7;
        }
      }
      instr = instr + 1;
    }
  }
  return bVar7;
}

Assistant:

bool Compiler::block_is_pure(const SPIRBlock &block)
{
	// This is a global side effect of the function.
	if (block.terminator == SPIRBlock::Kill ||
	    block.terminator == SPIRBlock::TerminateRay ||
	    block.terminator == SPIRBlock::IgnoreIntersection ||
	    block.terminator == SPIRBlock::EmitMeshTasks)
		return false;

	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		case OpFunctionCall:
		{
			uint32_t func = ops[2];
			if (!function_is_pure(get<SPIRFunction>(func)))
				return false;
			break;
		}

		case OpCopyMemory:
		case OpStore:
		{
			auto &type = expression_type(ops[0]);
			if (type.storage != StorageClassFunction)
				return false;
			break;
		}

		case OpImageWrite:
			return false;

		// Atomics are impure.
		case OpAtomicLoad:
		case OpAtomicStore:
		case OpAtomicExchange:
		case OpAtomicCompareExchange:
		case OpAtomicCompareExchangeWeak:
		case OpAtomicIIncrement:
		case OpAtomicIDecrement:
		case OpAtomicIAdd:
		case OpAtomicISub:
		case OpAtomicSMin:
		case OpAtomicUMin:
		case OpAtomicSMax:
		case OpAtomicUMax:
		case OpAtomicAnd:
		case OpAtomicOr:
		case OpAtomicXor:
			return false;

		// Geometry shader builtins modify global state.
		case OpEndPrimitive:
		case OpEmitStreamVertex:
		case OpEndStreamPrimitive:
		case OpEmitVertex:
			return false;

		// Mesh shader functions modify global state.
		// (EmitMeshTasks is a terminator).
		case OpSetMeshOutputsEXT:
			return false;

		// Barriers disallow any reordering, so we should treat blocks with barrier as writing.
		case OpControlBarrier:
		case OpMemoryBarrier:
			return false;

		// Ray tracing builtins are impure.
		case OpReportIntersectionKHR:
		case OpIgnoreIntersectionNV:
		case OpTerminateRayNV:
		case OpTraceNV:
		case OpTraceRayKHR:
		case OpExecuteCallableNV:
		case OpExecuteCallableKHR:
		case OpRayQueryInitializeKHR:
		case OpRayQueryTerminateKHR:
		case OpRayQueryGenerateIntersectionKHR:
		case OpRayQueryConfirmIntersectionKHR:
		case OpRayQueryProceedKHR:
			// There are various getters in ray query, but they are considered pure.
			return false;

			// OpExtInst is potentially impure depending on extension, but GLSL builtins are at least pure.

		case OpDemoteToHelperInvocationEXT:
			// This is a global side effect of the function.
			return false;

		case OpExtInst:
		{
			uint32_t extension_set = ops[2];
			if (get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
			{
				auto op_450 = static_cast<GLSLstd450>(ops[3]);
				switch (op_450)
				{
				case GLSLstd450Modf:
				case GLSLstd450Frexp:
				{
					auto &type = expression_type(ops[5]);
					if (type.storage != StorageClassFunction)
						return false;
					break;
				}

				default:
					break;
				}
			}
			break;
		}

		default:
			break;
		}
	}

	return true;
}